

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

bool IsProxy(CNetAddr *addr)

{
  long lVar1;
  CNetAddr *in_RDI;
  long in_FS_OFFSET;
  int i;
  UniqueLock<GlobalMutex> criticalblock10;
  CNetAddr *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  byte in_stack_ffffffffffffff97;
  undefined1 in_stack_ffffffffffffffab;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar2;
  CNetAddr *pCVar3;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  byte bVar4;
  UniqueLock<GlobalMutex> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<GlobalMutex>((GlobalMutex *)in_stack_ffffffffffffff88);
  UniqueLock<GlobalMutex>::UniqueLock
            (in_stack_ffffffffffffffc8,
             (GlobalMutex *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             (char *)in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac,(bool)in_stack_ffffffffffffffab);
  iVar2 = 0;
  do {
    if (6 < iVar2) {
      bVar4 = 0;
LAB_0198a984:
      UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffff88);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (bool)(bVar4 & 1);
      }
      __stack_chk_fail();
    }
    pCVar3 = in_RDI;
    CNetAddr::CNetAddr(in_RDI,(CNetAddr *)
                              CONCAT17(in_stack_ffffffffffffff97,
                                       CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)
                                      ));
    in_stack_ffffffffffffff97 =
         operator==(in_RDI,(CNetAddr *)
                           CONCAT17(in_stack_ffffffffffffff97,
                                    CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
    CNetAddr::~CNetAddr(in_stack_ffffffffffffff88);
    if ((in_stack_ffffffffffffff97 & 1) != 0) {
      bVar4 = 1;
      goto LAB_0198a984;
    }
    iVar2 = iVar2 + 1;
    in_RDI = pCVar3;
  } while( true );
}

Assistant:

bool IsProxy(const CNetAddr &addr) {
    LOCK(g_proxyinfo_mutex);
    for (int i = 0; i < NET_MAX; i++) {
        if (addr == static_cast<CNetAddr>(proxyInfo[i].proxy))
            return true;
    }
    return false;
}